

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O2

Value * soul::performIntrinsic
                  (Value *__return_storage_ptr__,IntrinsicType i,ArrayView<soul::Value> args)

{
  Category CVar1;
  Primitive PVar2;
  Value *pVVar3;
  bool bVar4;
  Value *pVVar5;
  undefined1 in_R9B;
  Value *a;
  Value *source;
  ArrayView<soul::Value> args_00;
  Type argType;
  Type t;
  Value result;
  ArrayWithPreallocation<soul::Value,_4UL> castArgs;
  Type local_1c8;
  ArrayView<soul::Value> local_1b0;
  Type local_1a0;
  Value local_188;
  undefined1 local_148 [280];
  
  local_1b0.e = args.e;
  local_1b0.s = args.s;
  pVVar5 = ArrayView<soul::Value>::front(&local_1b0);
  Type::Type(&local_1c8,&pVVar5->type);
  pVVar5 = local_1b0.e;
  source = local_1b0.s;
  do {
    pVVar3 = local_1b0.e;
    if (source == pVVar5) {
      local_148._0_8_ = local_148 + 0x18;
      local_148._8_8_ = 0;
      local_148._16_8_ = 4;
      for (pVVar5 = local_1b0.s; pVVar5 != pVVar3; pVVar5 = pVVar5 + 1) {
        Value::castToTypeExpectingSuccess(&local_188,pVVar5,&local_1c8);
        ArrayWithPreallocation<soul::Value,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148,&local_188);
        Value::~Value(&local_188);
      }
      args_00.s = (Value *)(local_148._0_8_ + local_148._8_8_ * 0x40);
      args_00.e._0_1_ = (local_1c8.primitiveType.type & ~void_) == float32;
      args_00.e._1_7_ = 0;
      CompileTimeIntrinsicEvaluation::perform
                (&local_188,(CompileTimeIntrinsicEvaluation *)(ulong)i,
                 (IntrinsicType)local_148._0_8_,args_00,(bool)in_R9B);
      if (local_188.type.category == invalid) {
        (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->allocatedData).allocatedSize = 0;
        (__return_storage_ptr__->type).category = invalid;
        (__return_storage_ptr__->type).arrayElementCategory = invalid;
        (__return_storage_ptr__->type).isRef = false;
        (__return_storage_ptr__->type).isConstant = false;
        (__return_storage_ptr__->type).primitiveType = invalid;
        (__return_storage_ptr__->type).boundingSize = 0;
        (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.items =
             (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
        (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
      }
      else if (local_188.type.primitiveType.type == bool_) {
        Value::Value(__return_storage_ptr__,&local_188);
      }
      else {
        local_1a0.boundingSize = local_1c8.boundingSize;
        local_1a0.arrayElementBoundingSize = local_1c8.arrayElementBoundingSize;
        local_1a0.structure.object = local_1c8.structure.object;
        if (local_1c8.structure.object != (Structure *)0x0) {
          ((local_1c8.structure.object)->super_RefCountedObject).refCount =
               ((local_1c8.structure.object)->super_RefCountedObject).refCount + 1;
        }
        local_1a0._0_8_ =
             CONCAT44(local_1c8.primitiveType.type,local_1c8._0_4_) & 0xffffffff0000ffff;
        Value::castToTypeExpectingSuccess(__return_storage_ptr__,&local_188,&local_1a0);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1a0.structure);
      }
      Value::~Value(&local_188);
      ArrayWithPreallocation<soul::Value,_4UL>::clear
                ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148);
LAB_001e81b0:
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1c8.structure);
      return __return_storage_ptr__;
    }
    PVar2 = (source->type).primitiveType.type;
    CVar1 = (source->type).category;
    if ((1 < PVar2 - int32 || CVar1 != primitive) &&
       (((PVar2 & ~void_) != float32 || (CVar1 != primitive)))) {
      (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
      (__return_storage_ptr__->allocatedData).allocatedSize = 0;
      (__return_storage_ptr__->type).category = invalid;
      (__return_storage_ptr__->type).arrayElementCategory = invalid;
      (__return_storage_ptr__->type).isRef = false;
      (__return_storage_ptr__->type).isConstant = false;
      (__return_storage_ptr__->type).primitiveType = invalid;
      (__return_storage_ptr__->type).boundingSize = 0;
      (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->allocatedData).allocatedData.items =
           (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
      (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
      (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
      goto LAB_001e81b0;
    }
    bVar4 = TypeRules::canPassAsArgumentTo(&local_1c8,&source->type,false);
    if (!bVar4) {
      Type::operator=(&local_1c8,&source->type);
    }
    source = source + 1;
  } while( true );
}

Assistant:

Value performIntrinsic (IntrinsicType i, ArrayView<Value> args)
{
    auto argType = args.front().getType();

    for (auto& a : args)
    {
        const auto& t = a.getType();

        if (! (t.isPrimitiveInteger() || t.isPrimitiveFloat()))
            return {};

        if (! TypeRules::canPassAsArgumentTo (argType, t, false))
            argType = t;
    }

    ArrayWithPreallocation<Value, 4> castArgs;

    for (auto& a : args)
        castArgs.push_back (a.castToTypeExpectingSuccess (argType));

    auto result = CompileTimeIntrinsicEvaluation::perform (i, castArgs, argType.isFloatingPoint());

    if (! result.isValid())
        return {};

    if (result.getType().isBool())
        return result;

    return result.castToTypeExpectingSuccess (argType.withConstAndRefFlags (false, false));
}